

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.hpp
# Opt level: O0

void __thiscall
unibn::Octree<Point3f,_std::vector<Point3f,_std::allocator<Point3f>_>_>::clear
          (Octree<Point3f,_std::vector<Point3f,_std::allocator<Point3f>_>_> *this)

{
  void *pvVar1;
  long in_RDI;
  Octant *this_00;
  
  this_00 = *(Octant **)(in_RDI + 0x10);
  if (this_00 != (Octant *)0x0) {
    Octant::~Octant(this_00);
    operator_delete(this_00,0x60);
  }
  if (((*(byte *)(in_RDI + 4) & 1) != 0) &&
     (pvVar1 = *(void **)(in_RDI + 0x18), pvVar1 != (void *)0x0)) {
    std::vector<Point3f,_std::allocator<Point3f>_>::~vector
              ((vector<Point3f,_std::allocator<Point3f>_> *)this_00);
    operator_delete(pvVar1,0x18);
  }
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10f753);
  return;
}

Assistant:

void Octree<PointT, ContainerT>::clear()
{
  delete root_;
  if (params_.copyPoints) delete data_;
  root_ = 0;
  data_ = 0;
  successors_.clear();
}